

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::on_piece_hashed
          (torrent *this,vector<sha256_hash> *block_hashes,piece_index_t piece,sha1_hash *piece_hash
          ,storage_error *error)

{
  undefined4 uVar1;
  undefined4 uVar2;
  session_interface *psVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  error_category *peVar9;
  tribool y;
  undefined8 uVar10;
  undefined8 uVar11;
  error_code eVar12;
  bool bVar13;
  bool bVar14;
  tribool y_00;
  tribool tVar15;
  int iVar16;
  int64_t file_offset;
  long lVar17;
  undefined4 extraout_var;
  file_storage *this_00;
  undefined4 extraout_var_00;
  undefined8 *puVar18;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  int iVar19;
  uint uVar20;
  value_t vVar21;
  int iVar22;
  long lVar23;
  tribool x;
  ulong uVar24;
  element_type *peVar25;
  piece_block block;
  piece_index_t pVar26;
  span<const_libtorrent::digest32<256L>_> block_hashes_00;
  initializer_list<int> __l;
  peer_request pVar27;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  anon_class_8_1_89900f17 get_int_setting;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_78;
  int local_70;
  uint local_6c;
  _Any_data local_68;
  undefined1 local_58 [24];
  error_code local_40;
  
  if ((((this->super_torrent_hot_members).field_0x4b & 4) == 0) && ((this->field_0x5e0 & 4) == 0)) {
    state_updated(this);
    iVar19 = (this->m_num_checked_pieces).m_val + 1;
    (this->m_num_checked_pieces).m_val = iVar19;
    if ((error->ec).val_ != 0) {
      local_a8 = (undefined1  [16])
                 boost::system::errc::make_error_condition(no_such_file_or_directory);
      bVar13 = boost::system::operator==(&error->ec,(error_condition *)local_a8);
      if (!bVar13) {
        _get_int_setting = boost::asio::error::make_error_code(eof);
        bVar13 = boost::system::operator==(&error->ec,(error_code *)&get_int_setting);
        if (!bVar13) {
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    (&local_40,file_too_short,(type *)0x0);
          bVar13 = boost::system::operator==(&error->ec,&local_40);
          if (!bVar13) {
            this->m_checking_piece = 0;
            this->m_num_checked_pieces = 0;
            iVar19 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[5])();
            if ((*(uint *)(CONCAT44(extraout_var_04,iVar19) + 0x68) & 0x49) != 0) {
              iVar19 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                         _vptr_session_logger[5])();
              resolve_filename_abi_cxx11_
                        ((string *)local_a8,this,(file_index_t)(int)*(int3 *)&error->field_0x10);
              get_handle((torrent *)&get_int_setting);
              alert_manager::
              emplace_alert<libtorrent::file_error_alert,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&,libtorrent::torrent_handle>
                        ((alert_manager *)CONCAT44(extraout_var_05,iVar19),&error->ec,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8,&error->operation,(torrent_handle *)&get_int_setting);
              ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_78);
              ::std::__cxx11::string::~string((string *)local_a8);
            }
            iVar19 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
            if ((char)iVar19 != '\0') {
              uVar20 = (error->ec).val_;
              peVar9 = (error->ec).cat_;
              (*peVar9->_vptr_error_category[4])(local_a8,peVar9,(ulong)uVar20);
              (*(this->super_request_callback)._vptr_request_callback[7])
                        (this,"on_piece_hashed, fatal disk error: (%d) %s",(ulong)uVar20,
                         local_a8._0_8_);
              ::std::__cxx11::string::~string((string *)local_a8);
            }
            auto_managed(this,false);
            pause(this);
            set_error(this,&error->ec,(file_index_t)(int)*(int3 *)&error->field_0x10);
            (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x2c])();
            return;
          }
        }
      }
      peVar25 = (this->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      file_offset = file_storage::file_size
                              (&peVar25->m_files,(file_index_t)(int)*(int3 *)&error->field_0x10);
      pVar27 = file_storage::map_file
                         (&peVar25->m_files,(file_index_t)(int)*(int3 *)&error->field_0x10,
                          file_offset,0);
      iVar19 = (this->m_num_checked_pieces).m_val;
      pVar26 = pVar27.piece.m_val;
      iVar16 = (this->m_checking_piece).m_val;
      iVar22 = pVar26.m_val - iVar16;
      if (iVar22 != 0 && iVar16 <= pVar26.m_val) {
        iVar19 = iVar19 + iVar22;
        (this->m_num_checked_pieces).m_val = iVar19;
        (this->m_checking_piece).m_val = pVar26.m_val;
      }
    }
    psVar3 = (this->super_torrent_hot_members).m_ses;
    lVar23 = (long)(((this->super_torrent_hot_members).m_torrent_file.
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->m_files).m_num_pieces;
    lVar17 = ((long)iVar19 * 1000000) / lVar23;
    *(short *)&this->field_0x604 = (short)lVar17;
    uVar20 = ((byte)this->field_0x606 & 0xf0) << 0x10 | (uint)lVar17 & 0xf0000;
    uVar24 = (ulong)(uVar20 >> 0x10);
    this->field_0x606 = (char)(uVar20 >> 0x10);
    iVar19 = (*(psVar3->super_session_logger)._vptr_session_logger[0x2e])
                       (psVar3,lVar23,((long)iVar19 * 1000000) % lVar23);
    bVar13 = session_settings::get_bool((session_settings *)CONCAT44(extraout_var,iVar19),0x8016);
    y_00.value = indeterminate_value;
    if (bVar13) {
      bVar13 = true;
      y_00.value = true_value;
      x.value = y_00.value;
    }
    else {
      bVar13 = info_hash_t::has_v1(&((this->super_torrent_hot_members).m_torrent_file.
                                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->m_info_hash);
      x.value = y_00.value;
      if (bVar13) {
        torrent_info::hash_for_piece
                  ((sha1_hash *)local_a8,
                   (this->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   piece);
        bVar13 = digest32<160L>::operator==(piece_hash,(digest32<160L> *)local_a8);
        x.value = (value_t)bVar13;
      }
      bVar14 = info_hash_t::has_v2(&((this->super_torrent_hot_members).m_torrent_file.
                                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->m_info_hash);
      bVar13 = false;
      if ((bVar14) &&
         (tVar15 = boost::logic::operator==(x,(tribool)0x0), tVar15.value != true_value)) {
        block_hashes_00.m_len = uVar24;
        block_hashes_00.m_ptr =
             (block_hashes->
             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>)
             .
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        y_00 = on_blocks_hashed(this,piece,block_hashes_00);
        bVar13 = y_00.value == true_value;
      }
    }
    vVar21 = indeterminate_value - (x.value == true_value && y_00.value == false_value);
    tVar15.value = false_value;
    if (y_00.value == false_value) {
      tVar15.value = vVar21;
    }
    if (!bVar13) {
      tVar15.value = vVar21;
    }
    if (x.value == false_value) {
      tVar15.value = false_value;
    }
    y.value = indeterminate_value - (y_00.value == true_value && x.value == false_value);
    if (x.value == true_value) {
      y.value = false_value;
    }
    if (y_00.value == false_value) {
      y.value = false_value;
    }
    tVar15 = boost::logic::operator||(tVar15,y);
    if (tVar15.value == true_value) {
      handle_inconsistent_hashes(this,piece);
    }
    else {
      tVar15 = boost::logic::operator||(x,y_00);
      if (tVar15.value == true_value) {
        if (((this->super_torrent_hot_members).m_picker._M_t.
             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
             (piece_picker *)0x0) || (((this->super_torrent_hot_members).field_0x4b & 0x40) == 0)) {
          need_picker(this);
          piece_picker::we_have
                    ((this->super_torrent_hot_members).m_picker._M_t.
                     super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                     .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                     piece);
          set_need_save_resume(this,(resume_data_flags_t)0x10);
          update_gauge(this);
        }
        we_have(this,piece,false);
      }
      else if (((y_00.value == indeterminate_value) && (x.value == indeterminate_value)) &&
              ((error->ec).val_ == 0)) {
        need_picker(this);
        uVar20 = piece_picker::blocks_in_piece
                           ((this->super_torrent_hot_members).m_picker._M_t.
                            super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                            .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                            _M_head_impl,piece);
        block.block_index = 0;
        block.piece_index.m_val = piece.m_val;
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        uVar24 = (ulong)uVar20;
        while (bVar13 = uVar24 != 0, uVar24 = uVar24 - 1, bVar13) {
          piece_picker::mark_as_finished
                    ((this->super_torrent_hot_members).m_picker._M_t.
                     super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                     .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                     block,(torrent_peer *)0x0);
          block = (piece_block)((long)block + 0x100000000);
        }
      }
      peVar25 = (this->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar19 = (peVar25->m_files).m_num_pieces;
      pVar26.m_val = (this->m_checking_piece).m_val;
      if ((pVar26.m_val < iVar19) &&
         ((this->super_torrent_hot_members).m_picker._M_t.
          super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
          ._M_t.
          super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
          .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
          (piece_picker *)0x0)) {
        do {
          bVar13 = piece_picker::have_piece
                             ((this->super_torrent_hot_members).m_picker._M_t.
                              super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                              .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                              _M_head_impl,pVar26);
          peVar25 = (this->super_torrent_hot_members).m_torrent_file.
                    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (!bVar13) {
            iVar19 = (peVar25->m_files).m_num_pieces;
            break;
          }
          uVar1 = this->m_checking_piece;
          uVar2 = this->m_num_checked_pieces;
          pVar26.m_val = uVar1 + 1;
          this->m_checking_piece = (piece_index_t)pVar26.m_val;
          this->m_num_checked_pieces = (piece_index_t)(uVar2 + 1);
          iVar19 = (peVar25->m_files).m_num_pieces;
        } while (pVar26.m_val < iVar19);
      }
      if ((this->m_num_checked_pieces).m_val < iVar19) {
        bVar13 = should_check_files(this);
        if (bVar13) {
          if ((this->m_checking_piece).m_val < iVar19) {
            bVar13 = info_hash_t::has_v1(&peVar25->m_info_hash);
            bVar14 = info_hash_t::has_v2(&((this->super_torrent_hot_members).m_torrent_file.
                                           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->m_info_hash);
            if (bVar14) {
              this_00 = torrent_info::orig_files
                                  ((this->super_torrent_hot_members).m_torrent_file.
                                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
              iVar19 = file_storage::blocks_in_piece2
                                 (this_00,(piece_index_t)(this->m_checking_piece).m_val);
              container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
              ::resize<int,void>((container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
                                  *)block_hashes,iVar19);
            }
            pdVar4 = (block_hashes->
                     super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ).
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar5 = (block_hashes->
                     super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ).
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            iVar19 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[4])();
            local_6c = (this->m_storage).m_idx.m_val;
            local_70 = (this->m_checking_piece).m_val;
            ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<libtorrent::aux::torrent,void>
                      ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_a8
                       ,(__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                        &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
            pdVar6 = (block_hashes->
                     super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ).
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar7 = (block_hashes->
                     super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ).
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_98 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&(block_hashes->
                            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                            ).
                            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                            ._M_impl.super__Vector_impl_data;
            p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (block_hashes->
                     super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ).
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (block_hashes->
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (block_hashes->
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (block_hashes->
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_58._0_16_ = (undefined1  [16])0x0;
            local_68 = (_Any_data)0x0;
            local_88._M_pi = p_Var8;
            puVar18 = (undefined8 *)operator_new(0x28);
            uVar10 = local_a8._0_8_;
            uVar11 = local_a8._8_8_;
            local_a8 = ZEXT816(0);
            *puVar18 = uVar10;
            puVar18[1] = uVar11;
            puVar18[2] = pdVar6;
            puVar18[3] = pdVar7;
            puVar18[4] = p_Var8;
            local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        )0x0;
            local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_68._M_unused._M_object = puVar18;
            local_58._8_8_ =
                 ::std::
                 _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2636:7)>
                 ::_M_invoke;
            local_58._0_8_ =
                 ::std::
                 _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2636:7)>
                 ::_M_manager;
            (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar19) + 0x20))
                      ((long *)CONCAT44(extraout_var_00,iVar19),local_6c,local_70,pdVar4,
                       (long)pdVar5 - (long)pdVar4 >> 5,bVar13 << 5 | 0x18,&local_68);
            ::std::_Function_base::~_Function_base((_Function_base *)&local_68);
            on_piece_hashed(libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::digest32<160l>const&,libtorrent::storage_error_const&)
            ::$_0::~__0((__0 *)local_a8);
            (this->m_checking_piece).m_val = (this->m_checking_piece).m_val + 1;
            (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x1f])();
            (*(this->super_request_callback)._vptr_request_callback[7])
                      (this,"on_piece_hashed, m_checking_piece: %d",
                       (ulong)(uint)(this->m_checking_piece).m_val);
          }
        }
        else {
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"on_piece_hashed, checking paused");
          if (((this->m_checking_piece).m_val == (this->m_num_checked_pieces).m_val) &&
             (iVar19 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                         _vptr_session_logger[5])(),
             (*(uint *)(CONCAT44(extraout_var_02,iVar19) + 0x68) & 0x40) != 0)) {
            iVar19 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[5])();
            get_handle((torrent *)local_a8);
            alert_manager::
            emplace_alert<libtorrent::torrent_paused_alert,libtorrent::torrent_handle>
                      ((alert_manager *)CONCAT44(extraout_var_03,iVar19),(torrent_handle *)local_a8)
            ;
            ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                      ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
          }
        }
      }
      else {
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"on_piece_hashed, completed");
        iVar19 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2e])();
        eVar12 = _get_int_setting;
        get_int_setting.pack._4_4_ = extraout_var_01;
        get_int_setting.pack._0_4_ = iVar19;
        local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)eVar12.cat_;
        iVar19 = on_piece_hashed::anon_class_8_1_89900f17::operator()(&get_int_setting,0x4029);
        local_a8._0_4_ = iVar19;
        iVar19 = on_piece_hashed::anon_class_8_1_89900f17::operator()(&get_int_setting,0x402a);
        local_a8._4_4_ = iVar19;
        iVar19 = on_piece_hashed::anon_class_8_1_89900f17::operator()(&get_int_setting,0x402f);
        local_a8._8_4_ = iVar19;
        __l._M_len = 3;
        __l._M_array = (iterator)local_a8;
        iVar19 = ::std::min<int>(__l);
        iVar16 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x1c])();
        if ((iVar19 < iVar16) && ((this->field_0x600 & 1) != 0)) {
          set_paused(this,true,(pause_flags_t)0x0);
        }
        files_checked(this);
        this->m_checking_piece = 0;
        this->m_num_checked_pieces = 0;
      }
    }
  }
  return;
}

Assistant:

void torrent::on_piece_hashed(aux::vector<sha256_hash> block_hashes
		, piece_index_t const piece, sha1_hash const& piece_hash
		, storage_error const& error) try
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		if (m_abort) return;
		if (m_deleted) return;

		state_updated();

		++m_num_checked_pieces;

		if (error)
		{
			if (error.ec == boost::system::errc::no_such_file_or_directory
				|| error.ec == boost::asio::error::eof
				|| error.ec == lt::errors::file_too_short
#ifdef TORRENT_WINDOWS
				|| error.ec == error_code(ERROR_HANDLE_EOF, system_category())
#endif
				)
			{
				TORRENT_ASSERT(error.file() >= file_index_t(0));

				// skip this file by updating m_checking_piece to the first piece following it
				file_storage const& st = m_torrent_file->files();
				std::int64_t file_size = st.file_size(error.file());
				piece_index_t last = st.map_file(error.file(), file_size, 0).piece;
				if (m_checking_piece < last)
				{
					int diff = static_cast<int>(last) - static_cast<int>(m_checking_piece);
					m_num_checked_pieces = piece_index_t(static_cast<int>(m_num_checked_pieces) + diff);
					m_checking_piece = last;
				}
			}
			else
			{
				m_checking_piece = piece_index_t{0};
				m_num_checked_pieces = piece_index_t{0};
				if (m_ses.alerts().should_post<file_error_alert>())
					m_ses.alerts().emplace_alert<file_error_alert>(error.ec,
						resolve_filename(error.file()), error.operation, get_handle());

#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					debug_log("on_piece_hashed, fatal disk error: (%d) %s", error.ec.value()
						, error.ec.message().c_str());
				}
#endif
				auto_managed(false);
				pause();
				set_error(error.ec, error.file());

				// recalculate auto-managed torrents sooner
				// in order to start checking the next torrent
				m_ses.trigger_auto_manage();
				return;
			}
		}

		m_progress_ppm = std::uint32_t(std::int64_t(static_cast<int>(m_num_checked_pieces))
			* 1000000 / torrent_file().num_pieces());

		boost::tribool hash_passed[2]
			= { boost::indeterminate, boost::indeterminate };

		if (!settings().get_bool(settings_pack::disable_hash_checks))
		{
			if (torrent_file().info_hashes().has_v1())
				hash_passed[0] = piece_hash == m_torrent_file->hash_for_piece(piece);

			// if the v1 hash failed the check, don't add the v2 hashes to the
			// merkle tree. They are most likely invalid.
			if (torrent_file().info_hashes().has_v2() && !bool(hash_passed[0] == false))
			{
				hash_passed[1] = on_blocks_hashed(piece, block_hashes);
			}
		}
		else
		{
			hash_passed[0] = hash_passed[1] = true;
		}

		if ((hash_passed[0] && !hash_passed[1]) || (!hash_passed[0] && hash_passed[1]))
		{
			handle_inconsistent_hashes(piece);
			return;
		}
		else if (hash_passed[0] || hash_passed[1])
		{
			if (has_picker() || !m_have_all)
			{
				need_picker();
				m_picker->we_have(piece);
				set_need_save_resume(torrent_handle::if_download_progress);
				update_gauge();
			}
			we_have(piece);
		}
		else if (!error
			&& boost::indeterminate(hash_passed[0])
			&& boost::indeterminate(hash_passed[1]))
		{
			// The data exists but we don't have the hashes needed to verify
			// it yet. This is a special case because we want to say we have
			// the piece once the hash is verified and not download the data
			// unless the hash check fails. To get this effect we setup the
			// piece's state in the piece picker so that it looks like a piece
			// which is finished but not hash checked.
			need_picker();
			int const blocks_in_piece = m_picker->blocks_in_piece(piece);
			for (int i = 0; i < blocks_in_piece; ++i)
				m_picker->mark_as_finished(piece_block(piece, i), nullptr);
		}

		if (m_checking_piece < m_torrent_file->end_piece() && has_picker())
		{
			// skip pieces we already have
			while (m_picker->have_piece(m_checking_piece))
			{
				++m_checking_piece;
				++m_num_checked_pieces;
				if (m_checking_piece >= m_torrent_file->end_piece())
				{
					// actually, we already have outstanding jobs for
					// the remaining pieces. We just need to wait for them
					// to finish
					break;
				}
			}
		}

		if (m_num_checked_pieces < m_torrent_file->end_piece())
		{
			// we paused the checking
			if (!should_check_files())
			{
#ifndef TORRENT_DISABLE_LOGGING
				debug_log("on_piece_hashed, checking paused");
#endif
				if (m_checking_piece == m_num_checked_pieces)
				{
					// we are paused, and we just completed the last outstanding job.
					// now we can be considered paused
					if (alerts().should_post<torrent_paused_alert>())
						alerts().emplace_alert<torrent_paused_alert>(get_handle());
				}
				return;
			}

			if (m_checking_piece >= m_torrent_file->end_piece())
				return;

			auto flags = disk_interface::sequential_access | disk_interface::volatile_read;

			if (torrent_file().info_hashes().has_v1())
				flags |= disk_interface::v1_hash;
			if (torrent_file().info_hashes().has_v2())
				block_hashes.resize(torrent_file().orig_files().blocks_in_piece2(m_checking_piece));

			span<sha256_hash> v2_span(block_hashes);
			m_ses.disk_thread().async_hash(m_storage, m_checking_piece, v2_span, flags
				, [self = shared_from_this(), hashes = std::move(block_hashes)]
				(piece_index_t p, sha1_hash const& h, storage_error const& e)
				{ self->on_piece_hashed(std::move(hashes), p, h, e); });
			++m_checking_piece;
			m_ses.deferred_submit_jobs();
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("on_piece_hashed, m_checking_piece: %d"
				, static_cast<int>(m_checking_piece));
#endif
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("on_piece_hashed, completed");
#endif

		auto const& pack = settings();
		auto get_int_setting = [&pack](int const name) {
			int const v = pack.get_int(name);
			if (v < 0) return std::numeric_limits<int>::max();
			return v;
		};
		int const limit = std::min({
			get_int_setting(settings_pack::active_downloads)
			, get_int_setting(settings_pack::active_seeds)
			, get_int_setting(settings_pack::active_limit)});
		int const num_torrents = m_ses.num_torrents();
		if (m_auto_managed && num_torrents > limit)
		{
			// if we're auto managed and we've reached one of the limits. Assume
			// we need to be paused until the auto managed logic runs again
			// (which is triggered further down)
			set_paused(true);
		}

		// we're done checking! (this should cause a call to trigger_auto_manage)
		files_checked();

		// reset the checking state
		m_checking_piece = piece_index_t(0);
		m_num_checked_pieces = piece_index_t(0);
	}
	catch (...) { handle_exception(); }